

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QOcspResponse::isEqual(QOcspResponse *this,QOcspResponse *other)

{
  QOcspResponsePrivate *pQVar1;
  QOcspResponsePrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  if ((pQVar2->certificateStatus == pQVar1->certificateStatus) &&
     (pQVar2->revocationReason == pQVar1->revocationReason)) {
    bVar3 = QSslCertificate::operator==(&pQVar2->signerCert,&pQVar1->signerCert);
    if (bVar3) {
      bVar3 = QSslCertificate::operator==(&pQVar2->subjectCert,&pQVar1->subjectCert);
      return bVar3;
    }
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }